

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::to_resource_binding_abi_cxx11_(CompilerHLSL *this,SPIRVariable *var)

{
  int iVar1;
  bool bVar2;
  uint32_t id;
  uint uVar3;
  CompilerHLSL *pCVar4;
  SPIRType *in_RDX;
  uint32_t binding;
  uint32_t desc_set;
  bool is_readonly_1;
  Bitset flags_1;
  bool is_readonly;
  Bitset flags;
  StorageClass storage;
  HLSLBindingFlagBits resource_flags;
  char space;
  allocator local_2d;
  uint32_t local_2c;
  SPIRType *local_28;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type = in_RDX;
  var_local = var;
  this_local = this;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(in_RDX->super_IVariant).field_0xc);
  local_28 = Compiler::get<spirv_cross::SPIRType>((Compiler *)var,id);
  if (local_28->storage != StorageClassPushConstant) {
    local_2c = (type->super_IVariant).self.id;
    bVar2 = Compiler::has_decoration((Compiler *)var,(ID)local_2c,DecorationBinding);
    if (!bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_2d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
      return this;
    }
  }
  iVar1 = *(int *)&(local_28->super_IVariant).field_0xc;
  uVar3 = iVar1 - 0xf;
  if (3 < uVar3 && iVar1 != 0x13) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",(allocator *)((long)&binding + 3));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&binding + 3));
    return this;
  }
  pCVar4 = (CompilerHLSL *)(*(code *)(&DAT_005eb988 + *(int *)(&DAT_005eb988 + (ulong)uVar3 * 4)))()
  ;
  return pCVar4;
}

Assistant:

string CompilerHLSL::to_resource_binding(const SPIRVariable &var)
{
	const auto &type = get<SPIRType>(var.basetype);

	// We can remap push constant blocks, even if they don't have any binding decoration.
	if (type.storage != StorageClassPushConstant && !has_decoration(var.self, DecorationBinding))
		return "";

	char space = '\0';

	HLSLBindingFlagBits resource_flags = HLSL_BINDING_AUTO_NONE_BIT;

	switch (type.basetype)
	{
	case SPIRType::SampledImage:
		space = 't'; // SRV
		resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		break;

	case SPIRType::Image:
		if (type.image.sampled == 2 && type.image.dim != DimSubpassData)
		{
			if (has_decoration(var.self, DecorationNonWritable) && hlsl_options.nonwritable_uav_texture_as_srv)
			{
				space = 't'; // SRV
				resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
			}
			else
			{
				space = 'u'; // UAV
				resource_flags = HLSL_BINDING_AUTO_UAV_BIT;
			}
		}
		else
		{
			space = 't'; // SRV
			resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		}
		break;

	case SPIRType::Sampler:
		space = 's';
		resource_flags = HLSL_BINDING_AUTO_SAMPLER_BIT;
		break;

	case SPIRType::AccelerationStructure:
		space = 't'; // SRV
		resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		break;

	case SPIRType::Struct:
	{
		auto storage = type.storage;
		if (storage == StorageClassUniform)
		{
			if (has_decoration(type.self, DecorationBufferBlock))
			{
				Bitset flags = ir.get_buffer_block_flags(var);
				bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
				space = is_readonly ? 't' : 'u'; // UAV
				resource_flags = is_readonly ? HLSL_BINDING_AUTO_SRV_BIT : HLSL_BINDING_AUTO_UAV_BIT;
			}
			else if (has_decoration(type.self, DecorationBlock))
			{
				space = 'b'; // Constant buffers
				resource_flags = HLSL_BINDING_AUTO_CBV_BIT;
			}
		}
		else if (storage == StorageClassPushConstant)
		{
			space = 'b'; // Constant buffers
			resource_flags = HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT;
		}
		else if (storage == StorageClassStorageBuffer)
		{
			// UAV or SRV depending on readonly flag.
			Bitset flags = ir.get_buffer_block_flags(var);
			bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
			space = is_readonly ? 't' : 'u';
			resource_flags = is_readonly ? HLSL_BINDING_AUTO_SRV_BIT : HLSL_BINDING_AUTO_UAV_BIT;
		}

		break;
	}
	default:
		break;
	}

	if (!space)
		return "";

	uint32_t desc_set =
	    resource_flags == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT ? ResourceBindingPushConstantDescriptorSet : 0u;
	uint32_t binding = resource_flags == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT ? ResourceBindingPushConstantBinding : 0u;

	if (has_decoration(var.self, DecorationBinding))
		binding = get_decoration(var.self, DecorationBinding);
	if (has_decoration(var.self, DecorationDescriptorSet))
		desc_set = get_decoration(var.self, DecorationDescriptorSet);

	return to_resource_register(resource_flags, space, binding, desc_set);
}